

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorProto::SerializeWithCachedSizes
          (FileDescriptorProto *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  int32 iVar3;
  char *pcVar4;
  string *psVar5;
  DescriptorProto *value;
  EnumDescriptorProto *value_00;
  ServiceDescriptorProto *value_01;
  FieldDescriptorProto *value_02;
  FileOptions *value_03;
  SourceCodeInfo *value_04;
  UnknownFieldSet *pUVar6;
  int local_34;
  int local_30;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  CodedOutputStream *output_local;
  FileDescriptorProto *this_local;
  
  bVar1 = has_name(this);
  if (bVar1) {
    name_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar4,iVar2,SERIALIZE);
    psVar5 = name_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(1,psVar5,output);
  }
  bVar1 = has_package(this);
  if (bVar1) {
    package_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    package_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar4,iVar2,SERIALIZE);
    psVar5 = package_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(2,psVar5,output);
  }
  for (i_2 = 0; iVar2 = dependency_size(this), i_2 < iVar2; i_2 = i_2 + 1) {
    dependency_abi_cxx11_(this,i_2);
    pcVar4 = (char *)std::__cxx11::string::data();
    dependency_abi_cxx11_(this,i_2);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar4,iVar2,SERIALIZE);
    psVar5 = dependency_abi_cxx11_(this,i_2);
    internal::WireFormatLite::WriteString(3,psVar5,output);
  }
  for (i_3 = 0; iVar2 = message_type_size(this), i_3 < iVar2; i_3 = i_3 + 1) {
    value = message_type(this,i_3);
    internal::WireFormatLite::WriteMessageMaybeToArray(4,(MessageLite *)value,output);
  }
  for (i_4 = 0; iVar2 = enum_type_size(this), i_4 < iVar2; i_4 = i_4 + 1) {
    value_00 = enum_type(this,i_4);
    internal::WireFormatLite::WriteMessageMaybeToArray(5,(MessageLite *)value_00,output);
  }
  for (i_5 = 0; iVar2 = service_size(this), i_5 < iVar2; i_5 = i_5 + 1) {
    value_01 = service(this,i_5);
    internal::WireFormatLite::WriteMessageMaybeToArray(6,(MessageLite *)value_01,output);
  }
  for (i_6 = 0; iVar2 = extension_size(this), i_6 < iVar2; i_6 = i_6 + 1) {
    value_02 = extension(this,i_6);
    internal::WireFormatLite::WriteMessageMaybeToArray(7,(MessageLite *)value_02,output);
  }
  bVar1 = has_options(this);
  if (bVar1) {
    value_03 = options(this);
    internal::WireFormatLite::WriteMessageMaybeToArray(8,(MessageLite *)value_03,output);
  }
  bVar1 = has_source_code_info(this);
  if (bVar1) {
    value_04 = source_code_info(this);
    internal::WireFormatLite::WriteMessageMaybeToArray(9,(MessageLite *)value_04,output);
  }
  for (local_30 = 0; iVar2 = public_dependency_size(this), local_30 < iVar2; local_30 = local_30 + 1
      ) {
    iVar3 = public_dependency(this,local_30);
    internal::WireFormatLite::WriteInt32(10,iVar3,output);
  }
  for (local_34 = 0; iVar2 = weak_dependency_size(this), local_34 < iVar2; local_34 = local_34 + 1)
  {
    iVar3 = weak_dependency(this,local_34);
    internal::WireFormatLite::WriteInt32(0xb,iVar3,output);
  }
  pUVar6 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar6);
  if (!bVar1) {
    pUVar6 = unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(pUVar6,output);
  }
  return;
}

Assistant:

void FileDescriptorProto::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->name(), output);
  }

  // optional string package = 2;
  if (has_package()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->package().data(), this->package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      2, this->package(), output);
  }

  // repeated string dependency = 3;
  for (int i = 0; i < this->dependency_size(); i++) {
  ::google::protobuf::internal::WireFormat::VerifyUTF8String(
    this->dependency(i).data(), this->dependency(i).length(),
    ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      3, this->dependency(i), output);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (int i = 0; i < this->message_type_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      4, this->message_type(i), output);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (int i = 0; i < this->enum_type_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      5, this->enum_type(i), output);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (int i = 0; i < this->service_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      6, this->service(i), output);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (int i = 0; i < this->extension_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      7, this->extension(i), output);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (has_options()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      8, this->options(), output);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (has_source_code_info()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      9, this->source_code_info(), output);
  }

  // repeated int32 public_dependency = 10;
  for (int i = 0; i < this->public_dependency_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(
      10, this->public_dependency(i), output);
  }

  // repeated int32 weak_dependency = 11;
  for (int i = 0; i < this->weak_dependency_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(
      11, this->weak_dependency(i), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}